

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool __thiscall tinyusdz::Layer::find_primspec_at(Layer *this,Path *path,PrimSpec **ps,string *err)

{
  Layer *this_00;
  char cVar1;
  size_type sVar2;
  ostream *poVar3;
  iterator iVar4;
  mapped_type *ppPVar5;
  string *args;
  long lVar6;
  char *pcVar7;
  undefined1 *puVar8;
  Layer *pLVar9;
  ostringstream ss_e;
  string local_210;
  Layer *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (ps == (PrimSpec **)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"find_primspec_at",0x10)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,0x861);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar7 = "Invalid PrimSpec dst argument";
    lVar6 = 0x1d;
LAB_0014715d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err == (string *)0x0) goto LAB_0014733c;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append
              ((char *)err,
               CONCAT71(local_210._M_dataplus._M_p._1_7_,(char)local_210._M_dataplus._M_p));
    puVar8 = (undefined1 *)
             CONCAT71(local_210._M_dataplus._M_p._1_7_,(char)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8 == &local_210.field_2) goto LAB_0014733c;
  }
  else {
    if (path->_valid == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                 ,0x54);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"find_primspec_at",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,0x866);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      pcVar7 = "Invalid path";
      lVar6 = 0xc;
      goto LAB_0014715d;
    }
    if (((path->_prim_part)._M_string_length != 0) && (*(path->_prim_part)._M_dataplus._M_p == '/'))
    {
      this_00 = this + 0x1580;
      if (this[0x15b0] == (Layer)0x1) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                    *)this_00,*(_Link_type *)(this + 0x1590));
        *(undefined8 *)(this + 0x1590) = 0;
        *(Layer **)(this + 0x1598) = this + 0x1588;
        *(Layer **)(this + 0x15a0) = this + 0x1588;
        *(undefined8 *)(this + 0x15a8) = 0;
        this[0x15b0] = (Layer)0x0;
      }
      else {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                        *)this_00,&path->_prim_part);
        if (iVar4._M_node != (_Base_ptr)(this + 0x1588)) {
          *ps = *(PrimSpec **)(iVar4._M_node + 2);
          return true;
        }
      }
      pLVar9 = this + 0x30;
      local_1f0 = this_00;
      do {
        pLVar9 = *(Layer **)pLVar9;
        if (pLVar9 == (Layer *)0x0) {
          return false;
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
        anon_unknown_240::GetPrimSpecAtPathRec
                  ((optional<const_tinyusdz::PrimSpec_*> *)&local_210,(PrimSpec *)(pLVar9 + 0x28),
                   local_1a8,path,0);
        sVar2 = local_210._M_string_length;
        cVar1 = (char)local_210._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
      } while (cVar1 == '\0');
      *ps = (PrimSpec *)sVar2;
      ppPVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                              *)local_1f0,&path->_prim_part);
      *ppPVar5 = (mapped_type)sVar2;
      return true;
    }
    args = err;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
               ,0x54);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"find_primspec_at",0x10)
    ;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)std::ostream::operator<<(local_1a8,0x86b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1e8[0] = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"TODO: Relative path: {}","");
    Path::full_path_name_abi_cxx11_(&local_1c8,path);
    fmt::format<std::__cxx11::string>(&local_210,(fmt *)local_1e8,&local_1c8,args);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (char *)CONCAT71(local_210._M_dataplus._M_p._1_7_,
                                         (char)local_210._M_dataplus._M_p),
                        local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_210._M_dataplus._M_p._1_7_,(char)local_210._M_dataplus._M_p) !=
        &local_210.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_210._M_dataplus._M_p._1_7_,(char)local_210._M_dataplus._M_p),
                      local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_1e8[0] != local_1d8) {
      operator_delete(local_1e8[0],local_1d8[0] + 1);
    }
    if (err == (string *)0x0) goto LAB_0014733c;
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_append
              ((char *)err,
               CONCAT71(local_210._M_dataplus._M_p._1_7_,(char)local_210._M_dataplus._M_p));
    puVar8 = (undefined1 *)
             CONCAT71(local_210._M_dataplus._M_p._1_7_,(char)local_210._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8 == &local_210.field_2) goto LAB_0014733c;
  }
  operator_delete(puVar8,local_210.field_2._M_allocated_capacity + 1);
LAB_0014733c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool Layer::find_primspec_at(const Path &path, const PrimSpec **ps,
                             std::string *err) const {
  if (!ps) {
    PUSH_ERROR_AND_RETURN("Invalid PrimSpec dst argument");
  }

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    PUSH_ERROR_AND_RETURN("Invalid path");
  }

  if (path.is_relative_path()) {
    // TODO
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: Relative path: {}", path.full_path_name()));
  }

  if (!path.is_absolute_path()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Path is not absolute path: {}", path.full_path_name()));
  }

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _primspec_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _primspec_path_cache.find(path.prim_part());
    if (ret != _primspec_path_cache.end()) {
      DCOUT("Found cache.");
      (*ps) = ret->second;
      return true;
    }
  }

  // Brute-force search.
  for (const auto &parent : _prim_specs) {
    if (auto pv = GetPrimSpecAtPathRec(&parent.second, /* parent_path */ "",
                                       path, /* depth */ 0)) {
      (*ps) = pv.value();

      // Add to cache.
      // Assume pointer address does not change unless dirty state changes.
      _primspec_path_cache[path.prim_part()] = pv.value();
      return true;
    }
  }

  return false;
}